

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

double get_max_bitrate(AV1LevelSpec *level_spec,int tier,BITSTREAM_PROFILE profile)

{
  double local_38;
  double local_30;
  double local_28;
  double bitrate_profile_factor;
  double bitrate_basis;
  BITSTREAM_PROFILE profile_local;
  int tier_local;
  AV1LevelSpec *level_spec_local;
  
  tier_local = tier;
  if (level_spec->level < 8) {
    tier_local = 0;
  }
  if (tier_local == 0) {
    local_28 = level_spec->main_mbps;
  }
  else {
    local_28 = level_spec->high_mbps;
  }
  if (profile == '\0') {
    local_30 = 1.0;
  }
  else {
    local_38 = 2.0;
    if (profile != '\x01') {
      local_38 = 3.0;
    }
    local_30 = local_38;
  }
  return local_28 * 1000000.0 * local_30;
}

Assistant:

static double get_max_bitrate(const AV1LevelSpec *const level_spec, int tier,
                              BITSTREAM_PROFILE profile) {
  if (level_spec->level < SEQ_LEVEL_4_0) tier = 0;
  const double bitrate_basis =
      (tier ? level_spec->high_mbps : level_spec->main_mbps) * 1e6;
  const double bitrate_profile_factor =
      profile == PROFILE_0 ? 1.0 : (profile == PROFILE_1 ? 2.0 : 3.0);
  return bitrate_basis * bitrate_profile_factor;
}